

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation_engine.cpp
# Opt level: O2

void __thiscall
cppurses::Animation_engine::register_widget
          (Animation_engine *this,Widget *w,
          function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()> *period_func)

{
  long *in_RAX;
  pointer *__ptr;
  unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
  local_28;
  
  local_28._M_t.
  super___uniq_ptr_impl<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppurses::detail::Timer_event_loop_*,_std::default_delete<cppurses::detail::Timer_event_loop>_>
  .super__Head_base<0UL,_cppurses::detail::Timer_event_loop_*,_false>._M_head_impl =
       (__uniq_ptr_data<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>,_true,_true>
        )(__uniq_ptr_data<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>,_true,_true>
          )in_RAX;
  std::
  make_unique<cppurses::detail::Timer_event_loop,std::function<std::chrono::duration<long,std::ratio<1l,1000l>>()>const&>
            ((function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()> *)&local_28);
  std::
  vector<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>,std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>>>
  ::
  emplace_back<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>>
            ((vector<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>,std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>>>
              *)&this->variable_loops_,&local_28);
  if (local_28._M_t.
      super___uniq_ptr_impl<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
      ._M_t.
      super__Tuple_impl<0UL,_cppurses::detail::Timer_event_loop_*,_std::default_delete<cppurses::detail::Timer_event_loop>_>
      .super__Head_base<0UL,_cppurses::detail::Timer_event_loop_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
       )0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super___uniq_ptr_impl<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cppurses::detail::Timer_event_loop_*,_std::default_delete<cppurses::detail::Timer_event_loop>_>
                          .super__Head_base<0UL,_cppurses::detail::Timer_event_loop_*,_false>.
                          _M_head_impl + 8))();
  }
  detail::Timer_event_loop::register_widget
            ((this->variable_loops_).
             super__Vector_base<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppurses::detail::Timer_event_loop_*,_std::default_delete<cppurses::detail::Timer_event_loop>_>
             .super__Head_base<0UL,_cppurses::detail::Timer_event_loop_*,_false>._M_head_impl,w);
  Event_loop::run_async
            (&((this->variable_loops_).
               super__Vector_base<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
               ._M_t.
               super__Tuple_impl<0UL,_cppurses::detail::Timer_event_loop_*,_std::default_delete<cppurses::detail::Timer_event_loop>_>
               .super__Head_base<0UL,_cppurses::detail::Timer_event_loop_*,_false>._M_head_impl)->
              super_Event_loop);
  return;
}

Assistant:

void Animation_engine::register_widget(
    Widget& w,
    const std::function<Period_t()>& period_func)
{
    variable_loops_.emplace_back(
        std::make_unique<detail::Timer_event_loop>(period_func));
    variable_loops_.back()->register_widget(w);
    variable_loops_.back()->run_async();
}